

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncError asciiToAscii(void *vctxt,uchar *out,int *poutlen,uchar *in,int *pinlen,int flush)

{
  uchar uVar1;
  xmlCharEncError xVar2;
  xmlCharEncError xVar3;
  xmlCharEncError xVar4;
  xmlCharEncError xVar5;
  long lVar6;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    return XML_ENC_ERR_SUCCESS;
  }
  xVar2 = *pinlen;
  xVar3 = *poutlen;
  xVar4 = xVar3;
  if (xVar2 <= xVar3) {
    xVar4 = xVar2;
  }
  xVar5 = XML_ENC_ERR_SPACE;
  if (xVar2 <= xVar3) {
    xVar5 = xVar2;
  }
  *poutlen = xVar4;
  *pinlen = xVar4;
  lVar6 = 0;
  while( true ) {
    if (in + xVar4 <= in + lVar6) {
      return xVar5;
    }
    uVar1 = in[lVar6];
    if ((char)uVar1 < '\0') break;
    out[lVar6] = uVar1;
    lVar6 = lVar6 + 1;
  }
  *poutlen = (int)lVar6;
  *pinlen = (int)lVar6;
  return XML_ENC_ERR_INPUT;
}

Assistant:

static xmlCharEncError
asciiToAscii(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}